

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O2

int coda_xml_parse(coda_xml_product *product)

{
  coda_product *pcVar1;
  int iVar2;
  XML_Status XVar3;
  XML_Error code;
  XML_Parser parser;
  coda_mem_record *pcVar4;
  coda_type_record *pcVar5;
  long lVar6;
  int *piVar7;
  __off_t _Var8;
  ssize_t sVar9;
  XML_LChar *pXVar10;
  XML_Index a;
  XML_Size XVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  uint8_t *s;
  long lVar15;
  long __offset;
  char byte_offset_str [21];
  parser_info_conflict local_2480;
  char buff [8192];
  
  local_2480.abort_parser = 0;
  local_2480.depth = -1;
  local_2480.attributes = (coda_dynamic_type *)0x0;
  local_2480.value_length = 0;
  local_2480.value_size = 0;
  local_2480.value = (char *)0x0;
  parser = coda_XML_ParserCreateNS((XML_Char *)0x0,' ');
  local_2480.parser = parser;
  if (parser == (XML_Parser)0x0) {
    coda_set_error(-0xe,"could not create XML parser");
    return -1;
  }
  local_2480.product = product;
  if (product->product_definition == (coda_product_definition *)0x0) {
    local_2480.update_definition = 1;
  }
  else {
    pcVar5 = (coda_type_record *)product->product_definition->root_type;
    local_2480.update_definition = (int)(pcVar5 == (coda_type_record *)0x0);
    if (pcVar5 != (coda_type_record *)0x0) {
      if (pcVar5->type_class != coda_record_class) {
        __assert_fail("product->product_definition->root_type->type_class == coda_record_class",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x30f,"int coda_xml_parse(coda_xml_product *)");
      }
      if (pcVar5->is_union != 0) {
        __assert_fail("!((coda_type_record *)product->product_definition->root_type)->is_union",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x310,"int coda_xml_parse(coda_xml_product *)");
      }
      pcVar4 = coda_mem_record_new(pcVar5,(coda_dynamic_type *)0x0);
      local_2480.record[0] = pcVar4;
      goto LAB_0015fb7b;
    }
  }
  pcVar5 = coda_type_record_new(coda_format_xml);
  if (pcVar5 == (coda_type_record *)0x0) {
    coda_XML_ParserFree(parser);
    return -1;
  }
  pcVar4 = coda_mem_record_new(pcVar5,(coda_dynamic_type *)0x0);
  local_2480.record[0] = pcVar4;
  coda_type_release((coda_type *)pcVar5);
LAB_0015fb7b:
  if (pcVar4 != (coda_mem_record *)0x0) {
    local_2480.definition[0] = (coda_type **)&pcVar4->definition;
    local_2480.index[0] = -1;
    local_2480.xml_name[0] = (char *)0x0;
    local_2480.depth = 0;
    coda_XML_SetUserData(parser,&local_2480);
    coda_XML_SetParamEntityParsing(local_2480.parser,XML_PARAM_ENTITY_PARSING_ALWAYS);
    coda_XML_SetElementHandler(local_2480.parser,start_element_handler,end_element_handler);
    coda_XML_SetCharacterDataHandler(local_2480.parser,character_data_handler);
    coda_XML_SetNotStandaloneHandler(local_2480.parser,not_standalone_handler);
    lVar13 = product->raw_product->file_size;
    lVar6 = lVar13 / 0x2000;
    uVar14 = (ulong)(lVar6 * 0x2000 < lVar13);
    lVar13 = lVar6 + uVar14;
    lVar6 = lVar6 + uVar14 + -1;
    piVar7 = (int *)__tls_get_addr(&PTR_001d8fb8);
    __offset = 0;
    if (lVar13 < 1) {
      lVar13 = __offset;
    }
    lVar15 = 0;
    do {
      if (lVar13 == lVar15) {
        coda_XML_ParserFree(local_2480.parser);
        local_2480.parser = (XML_Parser)0x0;
        if ((local_2480.update_definition == 0) ||
           (iVar2 = coda_mem_type_update
                              ((coda_dynamic_type **)local_2480.record,
                               (coda_type *)local_2480.record[0]->definition), iVar2 == 0)) {
          product->root_type = (coda_dynamic_type *)local_2480.record[0];
          local_2480.depth = -1;
          parser_info_cleanup(&local_2480);
          return 0;
        }
        goto LAB_0015fe39;
      }
      pcVar1 = product->raw_product;
      if (*(int *)&pcVar1[1].filename == 0) {
        _Var8 = lseek(*(int *)((long)&pcVar1[1].filename + 4),__offset,0);
        if (_Var8 < 0) {
          coda_str64(__offset,byte_offset_str);
          piVar7 = __errno_location();
          pcVar12 = strerror(*piVar7);
          coda_set_error(-0x16,"could not move to byte position %s (%s)",byte_offset_str,pcVar12);
          goto LAB_0015fe39;
        }
        s = (uint8_t *)buff;
        sVar9 = read(*(int *)((long)&product->raw_product[1].filename + 4),s,0x2000);
        iVar2 = (int)sVar9;
        if (iVar2 < 0) {
          piVar7 = __errno_location();
          pcVar12 = strerror(*piVar7);
          coda_set_error(-0x16,"could not read from file (%s)",pcVar12);
          goto LAB_0015fe39;
        }
      }
      else {
        iVar2 = 0x2000;
        if (lVar6 <= lVar15) {
          iVar2 = (int)pcVar1->file_size + (int)lVar6 * -0x2000;
        }
        s = pcVar1->mem_ptr + __offset;
      }
      *piVar7 = 0;
      XVar3 = coda_XML_Parse(local_2480.parser,(char *)s,iVar2,(uint)(lVar6 == lVar15));
      if (XVar3 == XML_STATUS_ERROR) break;
      lVar15 = lVar15 + 1;
      __offset = __offset + 0x2000;
    } while (*piVar7 == 0);
    if (*piVar7 == 0) {
      code = coda_XML_GetErrorCode(local_2480.parser);
      pXVar10 = coda_XML_ErrorString(code);
      coda_set_error(-0xe,"xml parse error: %s",pXVar10);
    }
    a = coda_XML_GetCurrentByteIndex(local_2480.parser);
    coda_str64(a,byte_offset_str);
    XVar11 = coda_XML_GetCurrentLineNumber(local_2480.parser);
    coda_add_error_message(" (line: %lu, byte offset: %s)",XVar11,byte_offset_str);
  }
LAB_0015fe39:
  parser_info_cleanup(&local_2480);
  return -1;
}

Assistant:

int coda_xml_parse(coda_xml_product *product)
{
    char buff[BUFFSIZE];
    parser_info info;
    long num_blocks;
    long i;

    parser_info_init(&info);
    info.parser = XML_ParserCreateNS(NULL, ' ');
    if (info.parser == NULL)
    {
        coda_set_error(CODA_ERROR_XML, "could not create XML parser");
        return -1;
    }
    info.product = product;
    info.update_definition = (product->product_definition == NULL || product->product_definition->root_type == NULL);
    /* the root of the product is always a record, which will contain the top-level xml element as a field */
    if (info.update_definition)
    {
        coda_type_record *definition;

        definition = coda_type_record_new(coda_format_xml);
        if (definition == NULL)
        {
            XML_ParserFree(info.parser);
            return -1;
        }
        info.record[0] = coda_mem_record_new(definition, NULL);
        coda_type_release((coda_type *)definition);
    }
    else
    {
        assert(product->product_definition->root_type->type_class == coda_record_class);
        assert(!((coda_type_record *)product->product_definition->root_type)->is_union);
        info.record[0] = coda_mem_record_new((coda_type_record *)product->product_definition->root_type, NULL);
    }
    if (info.record[0] == NULL)
    {
        parser_info_cleanup(&info);
        return -1;
    }
    info.definition[0] = (coda_type **)&info.record[0]->definition;
    info.index[0] = -1;
    info.xml_name[0] = NULL;
    info.depth = 0;

    XML_SetUserData(info.parser, &info);
    XML_SetParamEntityParsing(info.parser, XML_PARAM_ENTITY_PARSING_ALWAYS);
    XML_SetElementHandler(info.parser, start_element_handler, end_element_handler);
    XML_SetCharacterDataHandler(info.parser, character_data_handler);
    XML_SetNotStandaloneHandler(info.parser, not_standalone_handler);

    /* we also need to parse in blocks for mmap-ed files since the file size may exceed MAX_INT */
    num_blocks = (long)(product->raw_product->file_size / BUFFSIZE);
    if (product->raw_product->file_size > num_blocks * BUFFSIZE)
    {
        num_blocks++;
    }
    for (i = 0; i < num_blocks; i++)
    {
        const char *buff_ptr;
        int length;
        int result;

        if (((coda_bin_product *)product->raw_product)->use_mmap)
        {
            if (i < num_blocks - 1)
            {
                length = BUFFSIZE;
            }
            else
            {
                length = (int)(product->raw_product->file_size - (num_blocks - 1) * BUFFSIZE);
            }
            buff_ptr = (const char *)&(product->raw_product->mem_ptr[i * BUFFSIZE]);
        }
        else
        {
            if (lseek(((coda_bin_product *)product->raw_product)->fd, (off_t)i * BUFFSIZE, SEEK_SET) < 0)
            {
                char byte_offset_str[21];

                coda_str64(i * BUFFSIZE, byte_offset_str);
                coda_set_error(CODA_ERROR_FILE_READ, "could not move to byte position %s (%s)", byte_offset_str,
                               strerror(errno));
                parser_info_cleanup(&info);
                return -1;
            }
            length = read(((coda_bin_product *)product->raw_product)->fd, buff, BUFFSIZE);
            if (length < 0)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
                parser_info_cleanup(&info);
                return -1;
            }
            buff_ptr = buff;
        }

        coda_errno = 0;
        result = XML_Parse(info.parser, buff_ptr, length, (i == num_blocks - 1));
        if (result == XML_STATUS_ERROR || coda_errno != 0)
        {
            char s[21];

            if (coda_errno == 0)
            {
                coda_set_error(CODA_ERROR_XML, "xml parse error: %s", XML_ErrorString(XML_GetErrorCode(info.parser)));
            }
            coda_str64(XML_GetCurrentByteIndex(info.parser), s);
            coda_add_error_message(" (line: %lu, byte offset: %s)", (long)XML_GetCurrentLineNumber(info.parser), s);
            parser_info_cleanup(&info);
            return -1;
        }
    }

    XML_ParserFree(info.parser);
    info.parser = NULL;

    if (info.update_definition)
    {
        if (coda_mem_type_update((coda_dynamic_type **)&info.record[0], (coda_type *)info.record[0]->definition) != 0)
        {
            parser_info_cleanup(&info);
            return -1;
        }
    }

    product->root_type = (coda_dynamic_type *)info.record[0];
    info.depth = -1;

    parser_info_cleanup(&info);

    return 0;
}